

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O3

DecoderResult * __thiscall
ZXing::Pdf417::DecodeCodewords
          (DecoderResult *__return_storage_ptr__,Pdf417 *this,
          vector<int,_std::allocator<int>_> *codewords,int numECCodewords,
          vector<int,_std::allocator<int>_> *erasures)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  byte bVar5;
  pointer psVar6;
  pointer psVar7;
  undefined8 uVar8;
  pointer piVar9;
  pointer piVar10;
  Pdf417 *pPVar11;
  pointer piVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  uint extraout_EAX;
  uint uVar17;
  DecoderResult *extraout_RAX;
  DecoderResult *extraout_RAX_00;
  DecoderResult *extraout_RAX_01;
  DecoderResult *extraout_RAX_02;
  DecoderResult *pDVar18;
  DecoderResult *extraout_RAX_03;
  DecoderResult *extraout_RAX_04;
  DecoderResult *extraout_RAX_05;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  uint uVar21;
  undefined4 in_register_0000000c;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  size_type __n;
  ulong uVar25;
  ulong uVar26;
  ModulusGF *pMVar27;
  int *piVar28;
  int iVar29;
  ulong uVar30;
  uint __len;
  long lVar31;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar33;
  vector<int,_std::allocator<int>_> formalDerivativeCoefficients;
  vector<int,_std::allocator<int>_> errorLocations;
  ModulusPoly rLastLast;
  vector<int,_std::allocator<int>_> S;
  ModulusPoly tLastLast;
  ModulusPoly rLast;
  ModulusPoly syndrome;
  ModulusPoly poly;
  undefined1 local_418 [24];
  pointer piStack_400;
  undefined1 local_3f8 [24];
  pointer local_3e0;
  ModulusPoly local_3d8;
  ModulusPoly local_3b8;
  Pdf417 *local_390;
  ModulusPoly local_388;
  ModulusPoly local_368;
  uint local_33c;
  ModulusGF *local_338;
  vector<int,_std::allocator<int>_> local_330;
  ModulusPoly local_318;
  ModulusPoly local_2f8;
  ModulusPoly local_2d8;
  ModulusPoly local_2b0;
  vector<int,_std::allocator<int>_> local_290;
  ModulusPoly local_278;
  DecoderResult *local_258;
  undefined1 local_250 [56];
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  ModulusPoly local_180;
  ModulusPoly local_160;
  ModulusGF *local_140;
  undefined8 local_138;
  undefined1 local_130 [33];
  undefined7 uStack_10f;
  undefined4 local_107;
  undefined2 local_103;
  char local_101;
  ModulusGF *local_100;
  ModulusGF *local_f8;
  undefined1 local_f0 [24];
  ModulusGF *local_d8;
  pointer local_c8;
  Error local_c0;
  Error local_90;
  Error local_60;
  
  local_390 = this;
  if (*(long *)this == *(long *)(this + 8)) {
    paVar20 = &local_60._msg.field_2;
    local_60._msg.field_2._M_local_buf[0] = '\0';
    local_60._msg.field_2._M_allocated_capacity._1_7_ = local_f0._1_7_;
    local_60._msg._M_string_length = 0;
    local_f8 = (ModulusGF *)0x0;
    local_f0[0] = 0;
    local_60._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_60._line = 0x23c;
    local_60._type = Format;
    local_100 = (ModulusGF *)local_f0;
    local_60._msg._M_dataplus._M_p = (pointer)paVar20;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_60);
    pDVar18 = extraout_RAX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._msg._M_dataplus._M_p != paVar20) {
      operator_delete(local_60._msg._M_dataplus._M_p,
                      CONCAT71(local_60._msg.field_2._M_allocated_capacity._1_7_,
                               local_60._msg.field_2._M_local_buf[0]) + 1);
      pDVar18 = extraout_RAX_00;
    }
    if (local_100 == (ModulusGF *)local_f0) {
      return pDVar18;
    }
    lVar31 = CONCAT71(local_f0._1_7_,local_f0[0]);
    pMVar27 = local_100;
  }
  else {
    uVar22 = (uint)codewords;
    uVar23 = (ulong)codewords & 0xffffffff;
    if ((uVar22 < 0x201) &&
       ((int)((ulong)((long)erasures - CONCAT44(in_register_0000000c,numECCodewords)) >> 2) <=
        ((int)((int)(uVar23 >> 0x1f) + uVar22) >> 1) + 3)) {
      local_258 = __return_storage_ptr__;
      GetModulusGF();
      ModulusPoly::ModulusPoly
                (&local_160,&GetModulusGF::field,(vector<int,_std::allocator<int>_> *)local_390);
      std::vector<int,_std::allocator<int>_>::vector(&local_290,uVar23,(allocator_type *)local_250);
      bVar2 = true;
      if (uVar22 != 0) {
        lVar31 = 0;
        bVar14 = 0;
        do {
          bVar5 = bVar14;
          if ((ulong)((long)GetModulusGF::field._expTable.
                            super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)GetModulusGF::field._expTable.
                            super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1) <= uVar23) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar23);
          }
          iVar15 = ModulusPoly::evaluateAt
                             (&local_160,
                              (int)GetModulusGF::field._expTable.
                                   super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar23]);
          *(int *)((long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar31) = iVar15;
          lVar31 = lVar31 + 4;
          bVar3 = 1 < (long)uVar23;
          uVar23 = uVar23 - 1;
          bVar14 = bVar5 | iVar15 != 0;
        } while (bVar3);
        if ((bool)(bVar5 | iVar15 != 0)) {
          ModulusPoly::ModulusPoly(&local_180,&GetModulusGF::field,&local_290);
          local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_388._field = (ModulusGF *)0x0;
          local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2d8._field = (ModulusGF *)0x0;
          local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ModulusGF::buildMonomial(&local_2b0,&GetModulusGF::field,uVar22,1);
          local_338 = local_180._field;
          std::vector<int,_std::allocator<int>_>::vector(&local_330,&local_180._coefficients);
          GetModulusGF();
          piVar12 = local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          piVar10 = local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          piVar9 = local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar27 = local_2b0._field;
          if ((int)((ulong)((long)local_2b0._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_2b0._coefficients.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2) <
              (int)((ulong)((long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
            local_2b0._field = local_338;
            local_338 = pMVar27;
            local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = piVar9;
            local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = piVar10;
            local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = piVar12;
          }
          local_250._0_8_ = local_2b0._field;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_250 + 8),&local_2b0._coefficients);
          local_418._0_8_ = local_338;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_418 + 8),&local_330);
          local_3f8._0_8_ = GetModulusGF::field._zero._field;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_3f8 + 8),
                     &GetModulusGF::field._zero._coefficients);
          local_3d8._field = GetModulusGF::field._one._field;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_3d8._coefficients,&GetModulusGF::field._one._coefficients);
          local_33c = uVar22 >> 1;
          if ((int)local_33c < (int)((ulong)(local_418._16_8_ - local_418._8_8_) >> 2)) {
            do {
              local_3b8._field = (ModulusGF *)local_250._0_8_;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_3b8._coefficients,
                         (vector<int,_std::allocator<int>_> *)(local_250 + 8));
              local_278._field = (ModulusGF *)local_3f8._0_8_;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_278._coefficients,
                         (vector<int,_std::allocator<int>_> *)(local_3f8 + 8));
              local_250._0_8_ = local_418._0_8_;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_250 + 8),
                         (vector<int,_std::allocator<int>_> *)(local_418 + 8));
              local_3f8._0_8_ = local_3d8._field;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_3f8 + 8),
                         &local_3d8._coefficients);
              if (local_250._16_8_ == local_250._8_8_) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              if (*(int *)local_250._8_8_ == 0) {
                if (local_278._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_278._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_278._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_278._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_3b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_3b8._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_3b8._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                bVar2 = false;
                goto LAB_00177870;
              }
              local_418._0_8_ = local_3b8._field;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_418 + 8),
                         &local_3b8._coefficients);
              local_2f8._field = GetModulusGF::field._zero._field;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_2f8._coefficients,&GetModulusGF::field._zero._coefficients);
              uVar23 = (long)(local_250._16_8_ - local_250._8_8_) >> 2;
              uVar25 = (local_250._16_8_ - local_250._8_8_) * -0x40000000 >> 0x20;
              if (!CARRY8(uVar25,uVar23)) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              iVar15 = ModulusGF::inverse(&GetModulusGF::field,
                                          *(int *)(local_250._8_8_ + (uVar25 + uVar23) * 4));
              uVar25 = local_418._16_8_ - local_418._8_8_;
              uVar30 = uVar25 >> 2;
              uVar23 = (ulong)(local_250._16_8_ - local_250._8_8_) >> 2;
              if ((int)uVar23 <= (int)uVar30) {
                do {
                  if (local_418._16_8_ == local_418._8_8_) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
                  }
                  if (*(int *)local_418._8_8_ == 0) break;
                  uVar26 = (long)(uVar25 * -0x40000000) >> 0x20;
                  if (!CARRY8(uVar26,(long)uVar25 >> 2)) {
                    std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
                  }
                  iVar24 = 0;
                  if ((iVar15 != 0) &&
                     (*(int *)(local_418._8_8_ + (uVar26 + ((long)uVar25 >> 2)) * 4) != 0)) {
                    iVar24 = (int)GetModulusGF::field._expTable.
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start
                                  [(long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start
                                         [*(int *)(local_418._8_8_ +
                                                  (uVar26 + ((long)uVar25 >> 2)) * 4)] +
                                   (long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar15]];
                  }
                  iVar29 = (int)uVar30 - (int)uVar23;
                  ModulusGF::buildMonomial(&local_318,&GetModulusGF::field,iVar29,iVar24);
                  ModulusPoly::add(&local_368,&local_2f8,&local_318);
                  piVar10 = local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  piVar9 = local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  local_2f8._field = local_368._field;
                  local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
                  local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_finish;
                  local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
                  local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (int *)0x0;
                  local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (int *)0x0;
                  local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (((ModulusGF *)piVar9 != (ModulusGF *)0x0) &&
                     (operator_delete(piVar9,(long)piVar10 - (long)piVar9),
                     local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (int *)0x0)) {
                    operator_delete(local_368._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_368._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_368._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_318._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_318._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_318._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  ModulusPoly::multiplyByMonomial(&local_318,(ModulusPoly *)local_250,iVar29,iVar24)
                  ;
                  ModulusPoly::subtract(&local_368,(ModulusPoly *)local_418,&local_318);
                  piVar9 = piStack_400;
                  uVar8 = local_418._8_8_;
                  local_418._0_8_ = local_368._field;
                  local_418._8_8_ =
                       local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
                  local_418._16_8_ =
                       local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_finish;
                  piStack_400 = local_368._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
                  local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (((int *)uVar8 != (int *)0x0) &&
                     (operator_delete((void *)uVar8,(long)piVar9 - uVar8),
                     (ModulusGF *)
                     local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (ModulusGF *)0x0)) {
                    operator_delete(local_368._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_368._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_368._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_318._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_318._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_318._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  uVar25 = local_418._16_8_ - local_418._8_8_;
                  uVar30 = uVar25 >> 2;
                  uVar23 = (ulong)(local_250._16_8_ - local_250._8_8_) >> 2;
                } while ((int)uVar23 <= (int)uVar30);
              }
              ModulusPoly::multiply
                        ((ModulusPoly *)(local_f0 + 0x10),&local_2f8,(ModulusPoly *)local_3f8);
              ModulusPoly::subtract(&local_318,(ModulusPoly *)(local_f0 + 0x10),&local_278);
              ModulusPoly::negative(&local_368,&local_318);
              piVar10 = local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
              piVar9 = local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_3d8._field = local_368._field;
              local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (((ModulusGF *)piVar9 != (ModulusGF *)0x0) &&
                 (operator_delete(piVar9,(long)piVar10 - (long)piVar9),
                 (ModulusGF *)
                 local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (ModulusGF *)0x0)) {
                operator_delete(local_368._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_368._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_368._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_318._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_318._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_318._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_d8 != (ModulusGF *)0x0) {
                operator_delete(local_d8,(long)local_c8 - (long)local_d8);
              }
              if ((ModulusGF *)
                  local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (ModulusGF *)0x0) {
                operator_delete(local_2f8._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_2f8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2f8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_278._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_278._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_278._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_278._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3b8._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_3b8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_3b8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
            } while ((int)local_33c < (int)((ulong)(local_418._16_8_ - local_418._8_8_) >> 2));
          }
          lVar31 = (long)local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       lVar31 + -1);
          }
          iVar15 = *(int *)((long)local_3d8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar31 * 4 + -4);
          if (iVar15 == 0) {
            bVar2 = false;
          }
          else {
            iVar15 = ModulusGF::inverse(&GetModulusGF::field,iVar15);
            ModulusPoly::multiply(&local_3b8,&local_3d8,iVar15);
            piVar10 = local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            piVar9 = local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_388._field = local_3b8._field;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((piVar9 != (pointer)0x0) &&
               (operator_delete(piVar9,(long)piVar10 - (long)piVar9),
               local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3b8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_3b8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            ModulusPoly::multiply(&local_3b8,(ModulusPoly *)local_418,iVar15);
            piVar10 = local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            piVar9 = local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_2d8._field = local_3b8._field;
            local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((piVar9 != (pointer)0x0) &&
               (operator_delete(piVar9,(long)piVar10 - (long)piVar9),
               local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_3b8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3b8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_3b8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            bVar2 = true;
          }
LAB_00177870:
          if ((ModulusGF *)
              local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (ModulusGF *)0x0) {
            operator_delete(local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_3d8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_3d8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((ModulusGF *)local_3f8._8_8_ != (ModulusGF *)0x0) {
            operator_delete((void *)local_3f8._8_8_,(long)local_3e0 - local_3f8._8_8_);
          }
          if ((int *)local_418._8_8_ != (int *)0x0) {
            operator_delete((void *)local_418._8_8_,(long)piStack_400 - local_418._8_8_);
          }
          if ((int *)local_250._8_8_ != (int *)0x0) {
            operator_delete((void *)local_250._8_8_,local_250._24_8_ - local_250._8_8_);
          }
          if (local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b0._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2b0._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b0._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (bVar2) {
            local_3f8._0_8_ = (ModulusGF *)0x0;
            local_3f8._8_8_ = (ModulusGF *)0x0;
            local_3f8._16_8_ = (pointer)0x0;
            GetModulusGF();
            iVar15 = (int)((ulong)((long)local_388._coefficients.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)local_388._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            iVar29 = iVar15 + -1;
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)local_3f8,(long)iVar29);
            iVar24 = 0;
            if ((1 < iVar15) && (iVar24 = 0, 1 < GetModulusGF::field._modulus)) {
              iVar24 = 0;
              iVar15 = 1;
              do {
                iVar16 = ModulusPoly::evaluateAt(&local_388,iVar15);
                if (iVar16 == 0) {
                  iVar16 = ModulusGF::inverse(&GetModulusGF::field,iVar15);
                  ((int *)local_3f8._0_8_)[iVar24] = iVar16;
                  iVar24 = iVar24 + 1;
                }
                iVar15 = iVar15 + 1;
              } while ((iVar15 < GetModulusGF::field._modulus) && (iVar24 < iVar29));
            }
            if (iVar24 == iVar29) {
              GetModulusGF();
              uVar23 = (long)local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              __n = (long)(uVar23 * 0x40000000 + -0x100000000) >> 0x20;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_418,__n,
                         (allocator_type *)local_250);
              psVar7 = GetModulusGF::field._logTable.
                       super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              psVar6 = GetModulusGF::field._expTable.
                       super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar17 = (uint)(uVar23 >> 2);
              if (1 < (int)uVar17) {
                uVar23 = (long)local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                piVar28 = (int *)local_418._0_8_ + __n;
                uVar25 = 1;
                lVar31 = -0x200000000;
                do {
                  piVar28 = piVar28 + -1;
                  if (!CARRY8(lVar31 >> 0x20,uVar23)) {
                    std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
                  }
                  if ((long)local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[(lVar31 >> 0x20) + uVar23] == 0
                     ) {
                    iVar15 = 0;
                  }
                  else {
                    iVar15 = (int)psVar6[(long)psVar7[uVar25] +
                                         (long)psVar7[local_388._coefficients.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [(lVar31 >> 0x20) + uVar23]]];
                  }
                  *piVar28 = iVar15;
                  uVar25 = uVar25 + 1;
                  lVar31 = lVar31 + -0x100000000;
                } while ((uVar17 & 0x7fffffff) != uVar25);
              }
              ModulusPoly::ModulusPoly
                        ((ModulusPoly *)local_250,&GetModulusGF::field,
                         (vector<int,_std::allocator<int>_> *)local_418);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_3d8,
                         (long)(local_3f8._8_8_ - local_3f8._0_8_) >> 2,(allocator_type *)&local_3b8
                        );
              uVar32 = extraout_XMM0_Da;
              uVar33 = extraout_XMM0_Db;
              if ((ModulusGF *)
                  local_3d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != local_3d8._field) {
                uVar23 = 0;
                do {
                  iVar24 = ModulusGF::inverse(&GetModulusGF::field,((int *)local_3f8._0_8_)[uVar23])
                  ;
                  iVar29 = ModulusPoly::evaluateAt(&local_2d8,iVar24);
                  iVar15 = -iVar29;
                  if (GetModulusGF::field._modulus - iVar29 < GetModulusGF::field._modulus) {
                    iVar15 = GetModulusGF::field._modulus - iVar29;
                  }
                  iVar24 = ModulusPoly::evaluateAt((ModulusPoly *)local_250,iVar24);
                  iVar29 = ModulusGF::inverse(&GetModulusGF::field,iVar24);
                  iVar24 = 0;
                  if ((iVar15 != 0) && (iVar24 = 0, iVar29 != 0)) {
                    iVar24 = (int)GetModulusGF::field._expTable.
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start
                                  [(long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar15] +
                                   (long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar29]];
                  }
                  (&(local_3d8._field)->_modulus)[uVar23] = iVar24;
                  uVar23 = uVar23 + 1;
                  uVar32 = extraout_XMM0_Da_00;
                  uVar33 = extraout_XMM0_Db_00;
                } while (uVar23 < (ulong)((long)local_3d8._coefficients.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start -
                                          (long)local_3d8._field >> 2));
              }
              if ((int *)local_250._8_8_ != (int *)0x0) {
                operator_delete((void *)local_250._8_8_,local_250._24_8_ - local_250._8_8_);
                uVar32 = extraout_XMM0_Da_01;
                uVar33 = extraout_XMM0_Db_01;
              }
              if ((ModulusGF *)local_418._0_8_ != (ModulusGF *)0x0) {
                operator_delete((void *)local_418._0_8_,local_418._16_8_ - local_418._0_8_);
                uVar32 = extraout_XMM0_Da_02;
                uVar33 = extraout_XMM0_Db_02;
              }
              if (local_3f8._8_8_ == local_3f8._0_8_) {
                bVar2 = true;
              }
              else {
                lVar31 = *(long *)(local_390 + 8);
                lVar1 = *(long *)local_390;
                uVar23 = 0;
                do {
                  dVar4 = ModulusGF::log(&GetModulusGF::field,(double)CONCAT44(uVar33,uVar32));
                  uVar32 = SUB84(dVar4,0);
                  uVar33 = (undefined4)((ulong)dVar4 >> 0x20);
                  uVar17 = ~extraout_EAX + (int)((ulong)(lVar31 - lVar1) >> 2);
                  bVar2 = (int)uVar17 >= 0;
                  if ((int)uVar17 < 0) break;
                  iVar24 = *(int *)(*(long *)local_390 + (ulong)uVar17 * 4) -
                           (&(local_3d8._field)->_modulus)[uVar23];
                  iVar15 = iVar24 + GetModulusGF::field._modulus;
                  if (iVar15 < GetModulusGF::field._modulus) {
                    iVar24 = iVar15;
                  }
                  *(int *)(*(long *)local_390 + (ulong)uVar17 * 4) = iVar24;
                  uVar23 = uVar23 + 1;
                } while (uVar23 < (ulong)((long)(local_3f8._8_8_ - local_3f8._0_8_) >> 2));
              }
              if (local_3d8._field != (ModulusGF *)0x0) {
                operator_delete(local_3d8._field,
                                (long)local_3d8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)local_3d8._field);
              }
            }
            else {
              bVar2 = false;
            }
            if ((ModulusGF *)local_3f8._0_8_ != (ModulusGF *)0x0) {
              operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ - local_3f8._0_8_);
            }
          }
          else {
            bVar2 = false;
          }
          if (local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2d8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2d8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_388._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_388._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_180._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_180._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_180._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
      }
      if (local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pDVar18 = local_258;
      pPVar11 = local_390;
      __return_storage_ptr__ = local_258;
      if (bVar2) {
        piVar28 = *(int **)local_390;
        if (0xf < (ulong)(*(long *)(local_390 + 8) - (long)piVar28)) {
          iVar15 = (int)((ulong)(*(long *)(local_390 + 8) - (long)piVar28) >> 2);
          if (*piVar28 <= iVar15) {
            if (*piVar28 + uVar22 != iVar15) {
              if (iVar15 - uVar22 == 0 || iVar15 < (int)uVar22) goto LAB_00177d52;
              *piVar28 = iVar15 - uVar22;
            }
            Decode((DecoderResult *)local_250,(vector<int,_std::allocator<int>_> *)local_390);
            lVar31 = (long)(int)(uVar22 * 100) /
                     (long)(int)((ulong)(*(long *)(pPVar11 + 8) - *(long *)pPVar11) >> 2);
            uVar17 = (uint)lVar31;
            uVar22 = -uVar17;
            if (0 < (int)uVar17) {
              uVar22 = uVar17;
            }
            __len = 1;
            if (9 < uVar22) {
              uVar23 = (ulong)uVar22;
              uVar13 = 4;
              do {
                __len = uVar13;
                uVar21 = (uint)uVar23;
                if (uVar21 < 100) {
                  __len = __len - 2;
                  goto LAB_00177f61;
                }
                if (uVar21 < 1000) {
                  __len = __len - 1;
                  goto LAB_00177f61;
                }
                if (uVar21 < 10000) goto LAB_00177f61;
                uVar23 = uVar23 / 10000;
                uVar13 = __len + 4;
              } while (99999 < uVar21);
              __len = __len + 1;
            }
LAB_00177f61:
            local_3f8._0_8_ = (ModulusGF *)(local_3f8 + 0x10);
            std::__cxx11::string::_M_construct
                      ((ulong)local_3f8,(char)__len - ((char)((ulong)lVar31 >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((long)(int *)local_3f8._0_8_ + (ulong)(uVar17 >> 0x1f)),__len,uVar22
                      );
            puVar19 = (undefined8 *)std::__cxx11::string::append(local_3f8);
            pMVar27 = (ModulusGF *)(puVar19 + 2);
            if ((ModulusGF *)*puVar19 == pMVar27) {
              local_418._16_8_ = *(undefined8 *)pMVar27;
              piStack_400 = (pointer)puVar19[3];
              local_418._0_8_ = (ModulusGF *)(local_418 + 0x10);
            }
            else {
              local_418._16_8_ = *(undefined8 *)pMVar27;
              local_418._0_8_ = (ModulusGF *)*puVar19;
            }
            local_418._8_8_ = puVar19[1];
            *puVar19 = pMVar27;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_218,(string *)local_418);
            DecoderResult::DecoderResult(pDVar18,(DecoderResult *)local_250);
            if ((ModulusGF *)local_418._0_8_ != (ModulusGF *)(local_418 + 0x10)) {
              operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
            }
            if ((ModulusGF *)local_3f8._0_8_ != (ModulusGF *)(local_3f8 + 0x10)) {
              operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
            }
            if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p != local_1b0) {
              operator_delete(local_1c0._M_p,local_1b0[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_p != &local_1d8) {
              operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
            }
            paVar20 = local_208;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_p != paVar20) {
              operator_delete(local_218._M_p,local_208[0]._M_allocated_capacity + 1);
              paVar20 = extraout_RAX_06;
            }
            if ((pointer)local_250._24_8_ != (pointer)0x0) {
              operator_delete((void *)local_250._24_8_,local_250._40_8_ - local_250._24_8_);
              paVar20 = extraout_RAX_07;
            }
            if ((ModulusGF *)local_250._0_8_ == (ModulusGF *)0x0) {
              return (DecoderResult *)paVar20;
            }
            uVar23 = local_250._16_8_ - local_250._0_8_;
            pMVar27 = (ModulusGF *)local_250._0_8_;
            goto LAB_00177eb0;
          }
        }
LAB_00177d52:
        paVar20 = &local_c0._msg.field_2;
        local_c0._msg.field_2._M_local_buf[0] = '\0';
        local_c0._msg.field_2._M_allocated_capacity._1_7_ = local_130._1_7_;
        local_c0._msg.field_2._9_4_ = local_130._9_4_;
        local_c0._msg.field_2._13_2_ = local_130._13_2_;
        local_c0._msg.field_2._M_local_buf[0xf] = local_130[0xf];
        local_c0._msg._M_string_length = 0;
        local_138 = 0;
        local_130[0] = 0;
        local_c0._file = "src/pdf417/PDFScanningDecoder.cpp";
        local_c0._line = 0x243;
        local_c0._type = Format;
        local_140 = (ModulusGF *)local_130;
        local_c0._msg._M_dataplus._M_p = (pointer)paVar20;
        DecoderResult::DecoderResult(local_258,&local_c0);
        pDVar18 = extraout_RAX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._msg._M_dataplus._M_p != paVar20) {
          operator_delete(local_c0._msg._M_dataplus._M_p,
                          CONCAT71(local_c0._msg.field_2._M_allocated_capacity._1_7_,
                                   local_c0._msg.field_2._M_local_buf[0]) + 1);
          pDVar18 = extraout_RAX_02;
        }
        if (local_140 == (ModulusGF *)local_130) {
          return pDVar18;
        }
        lVar31 = CONCAT71(local_130._1_7_,local_130[0]);
        pMVar27 = local_140;
        goto LAB_00177ead;
      }
    }
    paVar20 = &local_90._msg.field_2;
    local_90._msg.field_2._M_local_buf[0] = '\0';
    local_90._msg.field_2._M_allocated_capacity._1_7_ = uStack_10f;
    local_90._msg.field_2._9_4_ = local_107;
    local_90._msg.field_2._13_2_ = local_103;
    local_90._msg.field_2._M_local_buf[0xf] = local_101;
    local_90._msg._M_string_length = 0;
    local_130._24_8_ = (pointer)0x0;
    local_130[0x20] = 0;
    local_90._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_90._line = 0x240;
    local_90._type = Checksum;
    local_130._16_8_ = (ModulusGF *)(local_130 + 0x20);
    local_90._msg._M_dataplus._M_p = (pointer)paVar20;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_90);
    pDVar18 = extraout_RAX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._msg._M_dataplus._M_p != paVar20) {
      operator_delete(local_90._msg._M_dataplus._M_p,
                      CONCAT71(local_90._msg.field_2._M_allocated_capacity._1_7_,
                               local_90._msg.field_2._M_local_buf[0]) + 1);
      pDVar18 = extraout_RAX_04;
    }
    if ((ModulusGF *)local_130._16_8_ == (ModulusGF *)(local_130 + 0x20)) {
      return pDVar18;
    }
    lVar31 = CONCAT71(uStack_10f,local_130[0x20]);
    pMVar27 = (ModulusGF *)local_130._16_8_;
  }
LAB_00177ead:
  uVar23 = lVar31 + 1;
LAB_00177eb0:
  operator_delete(pMVar27,uVar23);
  return extraout_RAX_05;
}

Assistant:

static DecoderResult DecodeCodewords(std::vector<int>& codewords, int numECCodewords, const std::vector<int>& erasures)
{
	if (codewords.empty())
		return FormatError();

	int correctedErrorsCount = 0;
	if (!CorrectErrors(codewords, erasures, numECCodewords, correctedErrorsCount))
		return ChecksumError();

	if (!VerifyCodewordCount(codewords, numECCodewords))
		return FormatError();

	// Decode the codewords
	return Decode(codewords).setEcLevel(std::to_string(numECCodewords * 100 / Size(codewords)) + "%");
}